

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O3

void WAsmJs::RegisterSpace::GetTypeDebugName(Types type,char16 *buf,uint bufsize,bool shortName)

{
  char16_t cVar1;
  short sVar2;
  bool bVar3;
  size_t __n;
  long lVar4;
  char16_t *pcVar5;
  ulong uVar6;
  char16 *__s;
  ulong uVar7;
  
  uVar7 = (ulong)bufsize;
  bVar3 = bufsize == 0 || buf == (char16 *)0x0;
  switch(type) {
  case INT32:
    if (bVar3) goto LAB_009594f3;
    pcVar5 = L"INT32";
    if (shortName) {
      pcVar5 = L"I";
    }
    __n = uVar7 * 2 - 2;
    uVar6 = 1;
    do {
      cVar1 = pcVar5[uVar6 - 1];
      buf[uVar6 - 1] = cVar1;
      if (cVar1 == L'\0') goto LAB_0095948f;
      uVar6 = uVar6 + 1;
      __n = __n - 2;
    } while (__n != 0xfffffffffffffffe);
    break;
  case INT64:
    if (bVar3) goto LAB_009594f3;
    pcVar5 = L"INT64";
    if (shortName) {
      pcVar5 = L"L";
    }
    __n = uVar7 * 2 - 2;
    uVar6 = 1;
    do {
      cVar1 = pcVar5[uVar6 - 1];
      buf[uVar6 - 1] = cVar1;
      if (cVar1 == L'\0') goto LAB_0095948f;
      uVar6 = uVar6 + 1;
      __n = __n - 2;
    } while (__n != 0xfffffffffffffffe);
    break;
  case FLOAT32:
    if (bVar3) goto LAB_009594f3;
    pcVar5 = L"FLOAT32";
    if (shortName) {
      pcVar5 = L"F";
    }
    __n = uVar7 * 2 - 2;
    uVar6 = 1;
    do {
      cVar1 = pcVar5[uVar6 - 1];
      buf[uVar6 - 1] = cVar1;
      if (cVar1 == L'\0') goto LAB_0095948f;
      uVar6 = uVar6 + 1;
      __n = __n - 2;
    } while (__n != 0xfffffffffffffffe);
    break;
  case FLOAT64:
    if (bVar3) goto LAB_009594f3;
    pcVar5 = L"FLOAT64";
    if (shortName) {
      pcVar5 = L"D";
    }
    __n = uVar7 * 2 - 2;
    uVar6 = 1;
    do {
      cVar1 = pcVar5[uVar6 - 1];
      buf[uVar6 - 1] = cVar1;
      if (cVar1 == L'\0') goto LAB_0095948f;
      uVar6 = uVar6 + 1;
      __n = __n - 2;
    } while (__n != 0xfffffffffffffffe);
    break;
  case SIMD:
    if (bVar3) goto LAB_009594f3;
    uVar6 = 1;
    lVar4 = 0;
    do {
      sVar2 = *(short *)((long)L"SIMD" + lVar4);
      *(short *)((long)buf + lVar4) = sVar2;
      if (sVar2 == 0) goto LAB_00959504;
      lVar4 = lVar4 + 2;
      uVar6 = uVar6 + 1;
    } while (uVar7 * 2 != lVar4);
    break;
  default:
    if (bVar3) goto LAB_009594f3;
    uVar6 = 1;
    lVar4 = 0;
    do {
      sVar2 = *(short *)((long)L"UNKNOWN" + lVar4);
      *(short *)((long)buf + lVar4) = sVar2;
      if (sVar2 == 0) goto LAB_00959504;
      lVar4 = lVar4 + 2;
      uVar6 = uVar6 + 1;
    } while (uVar7 * 2 != lVar4);
  }
  *buf = L'\0';
  if (1 < bufsize) {
    memset(buf + 1,0xfd,uVar7 * 2 - 2);
  }
LAB_009594f3:
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return;
LAB_00959504:
  if (uVar7 <= uVar6) {
    return;
  }
  __s = (char16 *)((long)buf + lVar4 + 2);
  __n = (uVar7 * 2 - lVar4) - 2;
  goto LAB_00959518;
LAB_0095948f:
  if (uVar7 <= uVar6) {
    return;
  }
  __s = buf + uVar6;
LAB_00959518:
  memset(__s,0xfd,__n);
  return;
}

Assistant:

void RegisterSpace::GetTypeDebugName(Types type, char16* buf, uint bufsize, bool shortName)
    {
        // Since this needs to be done manually for each type, this assert will make sure to not forget to update this if a new type is added
        CompileAssert(LIMIT == 5);

        switch (type)
        {
        case INT32: wcscpy_s(buf, bufsize  , shortName ? _u("I"): _u("INT32")); break;
        case INT64: wcscpy_s(buf, bufsize  , shortName ? _u("L"): _u("INT64")); break;
        case FLOAT32: wcscpy_s(buf, bufsize, shortName ? _u("F"): _u("FLOAT32")); break;
        case FLOAT64: wcscpy_s(buf, bufsize, shortName ? _u("D"): _u("FLOAT64")); break;
        case SIMD: wcscpy_s(buf, bufsize   , _u("SIMD")); break;
        default: wcscpy_s(buf, bufsize     , _u("UNKNOWN")); break;
        }
    }